

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

void __thiscall
pybind11::capsule::capsule(capsule *this,void *value,_func_void_void_ptr *destructor)

{
  int iVar1;
  PyObject *pPVar2;
  char *reason;
  
  (this->super_object).super_handle.m_ptr = (PyObject *)0x0;
  pPVar2 = (PyObject *)PyCapsule_New(value,0,capsule::anon_class_1_0_00000001::__invoke);
  (this->super_object).super_handle.m_ptr = pPVar2;
  if (pPVar2 == (PyObject *)0x0) {
    reason = "Could not allocate capsule object!";
  }
  else {
    iVar1 = PyCapsule_SetContext(pPVar2,destructor);
    if (iVar1 == 0) {
      return;
    }
    reason = "Could not set capsule context!";
  }
  pybind11_fail(reason);
}

Assistant:

capsule(const void *value, void (*destructor)(void *)) {
        m_ptr = PyCapsule_New(const_cast<void *>(value), nullptr, [](PyObject *o) {
            auto destructor = reinterpret_cast<void (*)(void *)>(PyCapsule_GetContext(o));
            void *ptr = PyCapsule_GetPointer(o, nullptr);
            destructor(ptr);
        });

        if (!m_ptr)
            pybind11_fail("Could not allocate capsule object!");

        if (PyCapsule_SetContext(m_ptr, (void *) destructor) != 0)
            pybind11_fail("Could not set capsule context!");
    }